

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

Aig_Man_t * Dar_ManBalanceXor(Aig_Man_t *pAig,int fExor,int fUpdateLevel,int fVerbose)

{
  Aig_Man_t *pAVar1;
  Aig_Man_t *pAVar2;
  
  if (fExor != 0) {
    pAVar1 = Aig_ManDupExor(pAig);
    if (fVerbose != 0) {
      Dar_BalancePrintStats(pAVar1);
    }
    pAVar2 = Dar_ManBalance(pAVar1,fUpdateLevel);
    Aig_ManStop(pAVar1);
    return pAVar2;
  }
  pAVar1 = Dar_ManBalance(pAig,fUpdateLevel);
  return pAVar1;
}

Assistant:

Aig_Man_t * Dar_ManBalanceXor( Aig_Man_t * pAig, int fExor, int fUpdateLevel, int fVerbose )
{
    Aig_Man_t * pAigXor, * pRes;
    if ( fExor )
    {
        pAigXor = Aig_ManDupExor( pAig );
        if ( fVerbose )
            Dar_BalancePrintStats( pAigXor );
        pRes = Dar_ManBalance( pAigXor, fUpdateLevel );
        Aig_ManStop( pAigXor );
    }
    else
    {
        pRes = Dar_ManBalance( pAig, fUpdateLevel );
    }
    return pRes;
}